

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.hpp
# Opt level: O2

string * __thiscall
I18N::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,I18N *this,string *id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  long lVar1;
  initializer_list<util::variant> __l;
  allocator_type local_111;
  string *local_110;
  vector<util::variant,_std::allocator<util::variant>_> v;
  variant local_f0;
  variant local_b0;
  variant local_70;
  
  local_110 = id;
  util::variant::variant(&local_f0,args);
  util::variant::variant(&local_b0,args_1);
  util::variant::variant(&local_70,args_2);
  __l._M_len = 3;
  __l._M_array = &local_f0;
  std::vector<util::variant,_std::allocator<util::variant>_>::vector(&v,__l,&local_111);
  lVar1 = 0x90;
  do {
    std::__cxx11::string::~string((string *)(local_f0.cache_val + lVar1 + -0x31));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x30);
  FormatV(__return_storage_ptr__,this,local_110,&v);
  std::vector<util::variant,_std::allocator<util::variant>_>::~vector(&v);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& id, Args&&... args) const
		{
			std::vector<util::variant> v{args...};
			return FormatV(id, std::move(v));
		}